

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O2

Test * GraphTestCycleInEdgesButNotInNodes4::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x228);
  GraphTestCycleInEdgesButNotInNodes4((GraphTestCycleInEdgesButNotInNodes4 *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(GraphTest, CycleInEdgesButNotInNodes4) {
  string err;
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build d: cat c\n"
"build c: cat b\n"
"build b: cat a\n"
"build a e: cat d\n"
"build f: cat e\n"));
  EXPECT_FALSE(scan_.RecomputeDirty(GetNode("f"), &err));
  ASSERT_EQ("dependency cycle: a -> d -> c -> b -> a", err);
}